

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O0

double __thiscall
Js::DateImplementation::SetDateData
          (DateImplementation *this,Arguments *args,DateData dd,bool fUtc,
          ScriptContext *scriptContext)

{
  uint uVar1;
  ulong uVar2;
  code *pcVar3;
  uint uVar4;
  bool bVar5;
  _E _Var6;
  BOOL BVar7;
  Var aValue;
  undefined4 *puVar8;
  double dVar9;
  bool local_b1;
  uint local_a0;
  uint ivar;
  uint cvarMax;
  uint count;
  YMD emptyYMD;
  YMD *pymd;
  double tv;
  double rgdbl [5];
  ScriptContext *scriptContext_local;
  bool fUtc_local;
  Arguments *args_local;
  DateImplementation *this_local;
  DateData dd_local;
  
  pymd = (YMD *)0x0;
  emptyYMD.wday = 0;
  emptyYMD.time = 0;
  this_local._7_1_ = dd._value;
  memset(&cvarMax,0,0x1c);
  DateData::operator_cast_to__E((DateData *)((long)&this_local + 7));
  bVar5 = DateData::operator>=((DateData *)((long)&this_local + 7),Lim);
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x687,"(false)","DateData type invalid");
    if (bVar5) {
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar8 = 0;
      JavascriptError::ThrowError(scriptContext,-0x7ff5ffcd,(PCWSTR)0x0);
    }
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  _Var6 = DateData::operator_cast_to__E((DateData *)((long)&this_local + 7));
  uVar1 = *(uint *)(mpddcvar + (ulong)_Var6 * 4);
  for (local_a0 = 0; uVar4 = local_a0,
      local_b1 = local_a0 < (SUB84(args->Info,0) & 0xffffff) - 1 && local_a0 < uVar1, local_b1;
      local_a0 = local_a0 + 1) {
    aValue = Arguments::operator[](args,local_a0 + 1);
    dVar9 = JavascriptConversion::ToNumber(aValue,scriptContext);
    rgdbl[(ulong)local_a0 - 1] = dVar9;
    bVar5 = NumberUtilities::IsFinite(rgdbl[(ulong)local_a0 - 1]);
    if (!bVar5) goto LAB_01073f5c;
    dVar9 = ConvertToInteger(rgdbl[(ulong)local_a0 - 1]);
    rgdbl[(ulong)local_a0 - 1] = dVar9;
  }
  ivar = local_a0;
  if (local_a0 == 0) {
LAB_01073f5c:
    this->m_grfval = 0;
    this->m_tvUtc = NumberConstants::NaN;
    this->field_0x58 = this->field_0x58 & 0xfe | 1;
    return this->m_tvUtc;
  }
  BVar7 = JavascriptNumber::IsNan(this->m_tvUtc);
  if (BVar7 == 0) {
    if (fUtc) {
      EnsureYmdUtc(this);
      emptyYMD._20_8_ = &this->m_ymdUtc;
      pymd = (YMD *)this->m_tvUtc;
    }
    else {
      EnsureYmdLcl<Js::ScriptContext>(this,scriptContext);
      emptyYMD._20_8_ = &this->m_ymdLcl;
      pymd = (YMD *)this->m_tvLcl;
    }
  }
  else {
    _Var6 = DateData::operator_cast_to__E((DateData *)((long)&this_local + 7));
    if ((_Var6 != FullYear) &&
       (_Var6 = DateData::operator_cast_to__E((DateData *)((long)&this_local + 7)), _Var6 != Year))
    goto LAB_01073f5c;
    emptyYMD._20_8_ = &cvarMax;
  }
  local_a0 = 0;
  _Var6 = DateData::operator_cast_to__E((DateData *)((long)&this_local + 7));
  switch(_Var6) {
  case Year:
    if ((tv < 100.0) && (0.0 <= tv)) {
      tv = tv + 1900.0;
    }
  case FullYear:
LAB_01073c4e:
    if ((ivar < 3) && (rgdbl[1] = (double)(*(int *)(emptyYMD._20_8_ + 0xc) + 1), ivar < 2)) {
      rgdbl[0] = (double)*(int *)(emptyYMD._20_8_ + 8);
    }
    pymd = (YMD *)DateUtilities::TvFromDate
                            (tv,rgdbl[0],rgdbl[1] - 1.0,(double)*(int *)(emptyYMD._20_8_ + 0x18));
    break;
  case Month:
    memmove_xplat(rgdbl,&tv,(ulong)uVar4 << 3);
    ivar = uVar4 + 1;
    tv = (double)*(int *)emptyYMD._20_8_;
    goto LAB_01073c4e;
  case Date:
    pymd = (YMD *)(((tv - (double)*(int *)(emptyYMD._20_8_ + 0xc)) - 1.0) * 86400000.0 +
                  (double)pymd);
    local_a0 = 1;
    if (uVar4 < 2) break;
  case Hours:
    pymd = (YMD *)((rgdbl[(ulong)local_a0 - 1] -
                   (double)(*(int *)(emptyYMD._20_8_ + 0x18) / 3600000)) * 3600000.0 + (double)pymd)
    ;
    local_a0 = local_a0 + 1;
    if (local_a0 < uVar4) {
switchD_01073c19_caseD_5:
      uVar2 = (long)*(int *)(emptyYMD._20_8_ + 0x18) / 60000;
      pymd = (YMD *)((rgdbl[(ulong)local_a0 - 1] -
                     (double)(int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 |
                                         uVar2 & 0xffffffff) % 0x3c)) * 60000.0 + (double)pymd);
      local_a0 = local_a0 + 1;
      if (local_a0 < uVar4) {
switchD_01073c19_caseD_6:
        uVar2 = (long)*(int *)(emptyYMD._20_8_ + 0x18) / 1000;
        pymd = (YMD *)((rgdbl[(ulong)local_a0 - 1] -
                       (double)(int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 |
                                           uVar2 & 0xffffffff) % 0x3c)) * 1000.0 + (double)pymd);
        local_a0 = local_a0 + 1;
        if (local_a0 < uVar4) {
switchD_01073c19_caseD_7:
          pymd = (YMD *)((rgdbl[(ulong)local_a0 - 1] -
                         (double)(*(int *)(emptyYMD._20_8_ + 0x18) % 1000)) + (double)pymd);
        }
      }
    }
    break;
  case Minutes:
    goto switchD_01073c19_caseD_5;
  case Seconds:
    goto switchD_01073c19_caseD_6;
  case Milliseconds:
    goto switchD_01073c19_caseD_7;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0x6fa,"(false)","DataData type invalid");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if (fUtc) {
    SetTvUtc(this,(double)pymd);
  }
  else {
    SetTvLcl(this,(double)pymd,scriptContext);
  }
  this->field_0x58 = this->field_0x58 & 0xfe | 1;
  return this->m_tvUtc;
}

Assistant:

double DateImplementation::SetDateData(Arguments args, DateData dd, bool fUtc, ScriptContext* scriptContext)
    {
        // This must accommodate the largest cvar in mpddcvar.
        double rgdbl[5];

        double tv = 0;
        DateTime::YMD *pymd = NULL;
        DateTime::YMD emptyYMD = {0};
        uint count = 0;

        uint cvarMax;
        uint ivar;

        // PREFAST: check limits
        if (dd < 0 || dd >= DateData::Lim)
        {
            AssertMsg(false, "DateData type invalid");
            Js::JavascriptError::ThrowError(scriptContext, VBSERR_InternalError);
        }

        // Get the parameters.
        cvarMax = mpddcvar[dd];

        __analysis_assume(cvarMax <= 4);

        //
        // arg[0] would be the date object itself
        //
        for (ivar = 0; (ivar < (args.Info.Count-1)) && ivar < cvarMax; ++ivar)
        {
            rgdbl[ivar] = JavascriptConversion::ToNumber(args[ivar+1],scriptContext);

            if (!Js::NumberUtilities::IsFinite(rgdbl[ivar]))
                goto LSetNan;

            rgdbl[ivar] = ConvertToInteger(rgdbl[ivar]);
        }

        if ((count = ivar) < 1)
        {
            goto LSetNan;
        }

        if (JavascriptNumber::IsNan(m_tvUtc))
        {


            // If the current time is not finite, the only way we can end up
            // with non-NaN is for setFullYear/setYear.
            // See ES5 15.9.5.40, ES5 B.2.5.
            if (!(DateData::FullYear == dd || DateData::Year == dd))
            {
                goto LSetNan;
            }
            pymd = &emptyYMD;           // We need mon, mday, time to be 0.
            // Fall through to DateData::Year and DataData::FullYear cases below.
        }
        else
        {
            if (fUtc)
            {
                EnsureYmdUtc();
                pymd = &m_ymdUtc;
                tv = m_tvUtc;
            }
            else
            {
                EnsureYmdLcl(scriptContext);
                pymd = &m_ymdLcl;
                tv = m_tvLcl;
            }
        }

        ivar = 0;
        switch (dd)
        {
        case DateData::Year:
            if (rgdbl[0] < 100 && rgdbl[0] >= 0)
                rgdbl[0] += 1900;
            // fall-through
        case DateData::FullYear:
    LFullYear:
            if (count < 3)
            {
                // Only {year} or {year, month} is specified. Day is not specified.
                rgdbl[2] = pymd->mday + 1;
                if (count < 2)
                {
                    // Month is not specified.
                    rgdbl[1] = pymd->mon;
                }
            }
            tv = TvFromDate(rgdbl[0], rgdbl[1], rgdbl[2] - 1, pymd->time);
            break;
        case DateData::Month:
            memmove(rgdbl + 1, rgdbl, count * sizeof(double));
            count++;
            rgdbl[0] = pymd->year;
            goto LFullYear;
        case DateData::Date:
            tv += (rgdbl[ivar] - pymd->mday - 1) * 86400000;
            if (++ivar >= count)
            {
                break;
            }
            // fall-through
        case DateData::Hours:
            tv += (rgdbl[ivar] - (pymd->time / 3600000)) * 3600000;
            if (++ivar >= count)
            {
                break;
            }
            // fall-through
        case DateData::Minutes:
            tv += (rgdbl[ivar] - (pymd->time / 60000) % 60) * 60000;
            if (++ivar >= count)
            {
                break;
            }
            // fall-through
        case DateData::Seconds:
            tv += (rgdbl[ivar] - (pymd->time / 1000) % 60) * 1000;
            if (++ivar >= count)
            {
                break;
            }
            // fall-through
        case DateData::Milliseconds:
            tv += rgdbl[ivar] - pymd->time % 1000;
            break;
        default:
            AssertMsg(false, "DataData type invalid");
        }

        if (fUtc)
        {
            SetTvUtc(tv);
        }
        else
        {
            SetTvLcl(tv, scriptContext);
        }

        m_modified = true;
        return m_tvUtc;

    LSetNan:
        m_grfval = 0;
        m_tvUtc = JavascriptNumber::NaN;
        m_modified = true;

        return m_tvUtc;
    }